

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::MultiThreadedObjectTest::pullObjectsFromShared
          (MultiThreadedObjectTest *this,TestThread *thread,int pbufferCount,int pixmapCount,
          int windowCount,int contextCount)

{
  vector<void_*,_std::allocator<void_*>_> *pvVar1;
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  *this_00;
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  *this_01;
  int iVar2;
  size_type sVar3;
  reference ppvVar4;
  reference __x;
  reference __x_00;
  vector<void_*,_std::allocator<void_*>_> *local_120;
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  *local_118;
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  *local_110;
  vector<void_*,_std::allocator<void_*>_> *local_108;
  Random *local_100;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_e8;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_e0;
  const_iterator local_d8;
  int local_d0;
  int local_cc;
  int ndx_3;
  int contextNdx;
  __normal_iterator<std::pair<eglu::NativeWindow_*,_void_*>_*,_std::vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>_>
  local_c0;
  __normal_iterator<std::pair<eglu::NativeWindow_*,_void_*>_*,_std::vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>_>
  local_b8;
  const_iterator local_b0;
  int local_a8;
  int local_a4;
  int ndx_2;
  int windowNdx;
  __normal_iterator<std::pair<eglu::NativePixmap_*,_void_*>_*,_std::vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>_>
  local_98;
  __normal_iterator<std::pair<eglu::NativePixmap_*,_void_*>_*,_std::vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>_>
  local_90;
  const_iterator local_88;
  int local_80;
  int local_7c;
  int ndx_1;
  int pixmapNdx;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_70;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_68;
  const_iterator local_60;
  int local_58;
  int local_54;
  int ndx;
  int pbufferNdx;
  vector<void_*,_std::allocator<void_*>_> *contexts;
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  *pixmaps;
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  *windows;
  vector<void_*,_std::allocator<void_*>_> *pbuffers;
  Random *rnd;
  int contextCount_local;
  int windowCount_local;
  int pixmapCount_local;
  int pbufferCount_local;
  TestThread *thread_local;
  MultiThreadedObjectTest *this_local;
  
  rnd._0_4_ = contextCount;
  rnd._4_4_ = windowCount;
  contextCount_local = pixmapCount;
  windowCount_local = pbufferCount;
  _pixmapCount_local = thread;
  thread_local = (TestThread *)this;
  iVar2 = TestThread::getId(thread);
  if (iVar2 == 0) {
    local_100 = &this->m_rnd0;
  }
  else {
    local_100 = &this->m_rnd1;
  }
  pbuffers = (vector<void_*,_std::allocator<void_*>_> *)local_100;
  iVar2 = TestThread::getId(_pixmapCount_local);
  if (iVar2 == 0) {
    local_108 = &this->m_pbuffers0;
  }
  else {
    local_108 = &this->m_pbuffers1;
  }
  windows = (vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             *)local_108;
  iVar2 = TestThread::getId(_pixmapCount_local);
  if (iVar2 == 0) {
    local_110 = &this->m_nativeWindows0;
  }
  else {
    local_110 = &this->m_nativeWindows1;
  }
  pixmaps = (vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             *)local_110;
  iVar2 = TestThread::getId(_pixmapCount_local);
  if (iVar2 == 0) {
    local_118 = &this->m_nativePixmaps0;
  }
  else {
    local_118 = &this->m_nativePixmaps1;
  }
  contexts = (vector<void_*,_std::allocator<void_*>_> *)local_118;
  iVar2 = TestThread::getId(_pixmapCount_local);
  if (iVar2 == 0) {
    local_120 = &this->m_contexts0;
  }
  else {
    local_120 = &this->m_contexts1;
  }
  _ndx = local_120;
  for (local_54 = 0; pvVar1 = pbuffers, local_54 < windowCount_local; local_54 = local_54 + 1) {
    sVar3 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedPbuffers);
    local_58 = de::Random::getInt((Random *)pvVar1,0,(int)sVar3 + -1);
    this_01 = windows;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_sharedPbuffers,(long)local_58);
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              ((vector<void_*,_std::allocator<void_*>_> *)this_01,ppvVar4);
    local_70._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::begin(&this->m_sharedPbuffers);
    local_68 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
               ::operator+(&local_70,(long)local_58);
    __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
    __normal_iterator<void**>
              ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)&local_60,
               &local_68);
    _ndx_1 = std::vector<void_*,_std::allocator<void_*>_>::erase(&this->m_sharedPbuffers,local_60);
  }
  for (local_7c = 0; pvVar1 = pbuffers, local_7c < contextCount_local; local_7c = local_7c + 1) {
    sVar3 = std::
            vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
            ::size(&this->m_sharedNativePixmaps);
    local_80 = de::Random::getInt((Random *)pvVar1,0,(int)sVar3 + -1);
    pvVar1 = contexts;
    __x = std::
          vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
          ::operator[](&this->m_sharedNativePixmaps,(long)local_80);
    std::
    vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
    ::push_back((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 *)pvVar1,__x);
    local_98._M_current =
         (pair<eglu::NativePixmap_*,_void_*> *)
         std::
         vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
         ::begin(&this->m_sharedNativePixmaps);
    local_90 = __gnu_cxx::
               __normal_iterator<std::pair<eglu::NativePixmap_*,_void_*>_*,_std::vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>_>
               ::operator+(&local_98,(long)local_80);
    __gnu_cxx::
    __normal_iterator<std::pair<eglu::NativePixmap*,void*>const*,std::vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>>
    ::__normal_iterator<std::pair<eglu::NativePixmap*,void*>*>
              ((__normal_iterator<std::pair<eglu::NativePixmap*,void*>const*,std::vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>>
                *)&local_88,&local_90);
    _ndx_2 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::erase(&this->m_sharedNativePixmaps,local_88);
  }
  for (local_a4 = 0; pvVar1 = pbuffers, local_a4 < rnd._4_4_; local_a4 = local_a4 + 1) {
    sVar3 = std::
            vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
            ::size(&this->m_sharedNativeWindows);
    local_a8 = de::Random::getInt((Random *)pvVar1,0,(int)sVar3 + -1);
    this_00 = pixmaps;
    __x_00 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_sharedNativeWindows,(long)local_a8);
    std::
    vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
    ::push_back((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 *)this_00,__x_00);
    local_c0._M_current =
         (pair<eglu::NativeWindow_*,_void_*> *)
         std::
         vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
         ::begin(&this->m_sharedNativeWindows);
    local_b8 = __gnu_cxx::
               __normal_iterator<std::pair<eglu::NativeWindow_*,_void_*>_*,_std::vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>_>
               ::operator+(&local_c0,(long)local_a8);
    __gnu_cxx::
    __normal_iterator<std::pair<eglu::NativeWindow*,void*>const*,std::vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>>
    ::__normal_iterator<std::pair<eglu::NativeWindow*,void*>*>
              ((__normal_iterator<std::pair<eglu::NativeWindow*,void*>const*,std::vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>>
                *)&local_b0,&local_b8);
    _ndx_3 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::erase(&this->m_sharedNativeWindows,local_b0);
  }
  for (local_cc = 0; pvVar1 = pbuffers, local_cc < (int)rnd; local_cc = local_cc + 1) {
    sVar3 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedContexts);
    local_d0 = de::Random::getInt((Random *)pvVar1,0,(int)sVar3 + -1);
    pvVar1 = _ndx;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_sharedContexts,(long)local_d0);
    std::vector<void_*,_std::allocator<void_*>_>::push_back(pvVar1,ppvVar4);
    local_e8._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::begin(&this->m_sharedContexts);
    local_e0 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
               ::operator+(&local_e8,(long)local_d0);
    __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
    __normal_iterator<void**>
              ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)&local_d8,
               &local_e0);
    std::vector<void_*,_std::allocator<void_*>_>::erase(&this->m_sharedContexts,local_d8);
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::pullObjectsFromShared (TestThread& thread, int pbufferCount, int pixmapCount, int windowCount, int contextCount)
{
	de::Random&											rnd			= (thread.getId() == 0 ? m_rnd0 : m_rnd1);
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < pbufferCount; pbufferNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedPbuffers.size()-1));

		pbuffers.push_back(m_sharedPbuffers[ndx]);
		m_sharedPbuffers.erase(m_sharedPbuffers.begin() + ndx);
	}

	for (int pixmapNdx = 0; pixmapNdx < pixmapCount; pixmapNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedNativePixmaps.size()-1));

		pixmaps.push_back(m_sharedNativePixmaps[ndx]);
		m_sharedNativePixmaps.erase(m_sharedNativePixmaps.begin() + ndx);
	}

	for (int windowNdx = 0; windowNdx < windowCount; windowNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedNativeWindows.size()-1));

		windows.push_back(m_sharedNativeWindows[ndx]);
		m_sharedNativeWindows.erase(m_sharedNativeWindows.begin() + ndx);
	}

	for (int contextNdx = 0; contextNdx < contextCount; contextNdx++)
	{
		const int ndx = rnd.getInt(0, (int)(m_sharedContexts.size()-1));

		contexts.push_back(m_sharedContexts[ndx]);
		m_sharedContexts.erase(m_sharedContexts.begin() + ndx);
	}
}